

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putilimp.h
# Opt level: O0

int32_t pinCapacity<char>(char *dest,int32_t capacity)

{
  int local_40;
  int32_t maxCapacity;
  uintptr_t maxBytes;
  uintptr_t maxInt;
  uintptr_t destInt;
  int32_t capacity_local;
  char *dest_local;
  
  dest_local._4_4_ = capacity;
  if (0 < capacity) {
    maxBytes = (uintptr_t)(dest + 0x7fffffff);
    if (maxBytes < dest) {
      maxBytes = 0xffffffffffffffff;
    }
    local_40 = (int)maxBytes - (int)dest;
    if (capacity <= local_40) {
      local_40 = capacity;
    }
    dest_local._4_4_ = local_40;
  }
  return dest_local._4_4_;
}

Assistant:

inline int32_t pinCapacity(T *dest, int32_t capacity) {
    if (capacity <= 0) { return capacity; }

    uintptr_t destInt = (uintptr_t)dest;
    uintptr_t maxInt;

#  if U_PLATFORM == U_PF_OS390 && !defined(_LP64)
    // We have 31-bit pointers.
    maxInt = 0x7fffffff;
#  elif U_PLATFORM == U_PF_OS400
    maxInt = (uintptr_t)uprv_maximumPtr((void *)dest);
#  else
    maxInt = destInt + 0x7fffffffu;
    if (maxInt < destInt) {
        // Less than 2GB to the end of the address space.
        // Pin to that to prevent address overflow.
        maxInt = (uintptr_t)-1;
    }
#  endif

    uintptr_t maxBytes = maxInt - destInt;  // max. 2GB
    int32_t maxCapacity = (int32_t)(maxBytes / sizeof(T));
    return capacity <= maxCapacity ? capacity : maxCapacity;
}